

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_append2_op(sexp ctx,sexp self,sexp_sint_t n,sexp a,sexp b)

{
  long in_RDI;
  sexp in_R8;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp b1;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp a1;
  sexp in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  bool bVar1;
  undefined1 *n_00;
  sexp self_00;
  sexp self_01;
  sexp psVar2;
  
  psVar2 = (sexp)&DAT_0000043e;
  memset(&stack0xffffffffffffffc0,0,0x10);
  memset(&stack0xffffffffffffffa8,0,0x10);
  self_01 = *(sexp *)(in_RDI + 0x6080);
  *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffffc0;
  n_00 = &stack0xffffffffffffffb8;
  self_00 = *(sexp *)(in_RDI + 0x6080);
  *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffffa8;
  psVar2 = sexp_reverse_op(psVar2,self_01,(sexp_sint_t)&stack0xffffffffffffffd0,in_R8);
  while( true ) {
    bVar1 = false;
    if (((ulong)psVar2 & 3) == 0) {
      bVar1 = psVar2->tag == 6;
    }
    if (bVar1 == false) break;
    in_R8 = sexp_cons_op(in_R8,self_00,(sexp_sint_t)n_00,
                         (sexp)CONCAT17(bVar1,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
    psVar2 = (psVar2->value).type.cpl;
  }
  *(sexp *)(in_RDI + 0x6080) = self_01;
  return in_R8;
}

Assistant:

sexp sexp_append2_op (sexp ctx, sexp self, sexp_sint_t n, sexp a, sexp b) {
  sexp_gc_var2(a1, b1);
  sexp_gc_preserve2(ctx, a1, b1);
  b1 = b;
  for (a1=sexp_reverse(ctx, a); sexp_pairp(a1); a1=sexp_cdr(a1))
    b1 = sexp_cons(ctx, sexp_car(a1), b1);
  sexp_gc_release2(ctx);
  return b1;
}